

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,string_view name)

{
  int iVar1;
  Endpoint **ppEVar2;
  Endpoint *pEVar3;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> ept;
  handle sharedEpt;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_48;
  handle local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_30,&this->mLocalEndpoints);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_48,local_30.data,name);
  iVar1 = ((local_30.data)->dataStorage).bsize;
  ppEVar2 = ((local_30.data)->dataStorage).dataptr;
  if (iVar1 == 0x20) {
    if (ppEVar2 == (Endpoint **)0x0) {
      ppEVar2 = (Endpoint **)
                &gmlc::containers::
                 StableBlockVector<helics::Endpoint,5u,std::allocator<helics::Endpoint>>::end()::
                 emptyValue;
    }
    else {
      ppEVar2 = ppEVar2 + (long)((local_30.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar1 = 0;
  }
  else {
    ppEVar2 = ppEVar2 + ((local_30.data)->dataStorage).dataSlotIndex;
  }
  pEVar3 = local_48.ptr;
  if (((ppEVar2 == local_48.vec) ||
      (((local_48.vec != (Endpoint **)0x0 && (*local_48.vec == (Endpoint *)0x0)) &&
       (*ppEVar2 == (Endpoint *)0x0)))) && (iVar1 == local_48.offset)) {
    pEVar3 = (Endpoint *)invalidEptNC;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30.m_handle_lock);
  return pEVar3;
}

Assistant:

Endpoint& MessageFederateManager::getEndpoint(std::string_view name)
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    return (ept != sharedEpt.end()) ? (*ept) : invalidEptNC;
}